

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::SerialArena::Init(SerialArena *this,ArenaBlock *b,size_t offset)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar1 = ArenaBlock::Pointer(b,offset);
  pcVar2 = ArenaBlock::Limit(b);
  (this->ptr_)._M_b._M_p = pcVar1;
  this->prefetch_ptr_ = pcVar1;
  this->limit_ = pcVar2;
  (this->head_)._M_b._M_p = b;
  (this->space_used_).super___atomic_base<unsigned_long>._M_i = 0;
  (this->space_allocated_).super___atomic_base<unsigned_long>._M_i = b->size;
  this->cached_block_length_ = '\0';
  this->cached_blocks_ = (CachedBlock **)0x0;
  (this->string_block_)._M_b._M_p = (__pointer_type)0x0;
  (this->string_block_unused_).super___atomic_base<unsigned_long>._M_i = 0;
  return;
}

Assistant:

void SerialArena::Init(ArenaBlock* b, size_t offset) {
  set_range(b->Pointer(offset), b->Limit());
  head_.store(b, std::memory_order_relaxed);
  space_used_.store(0, std::memory_order_relaxed);
  space_allocated_.store(b->size, std::memory_order_relaxed);
  cached_block_length_ = 0;
  cached_blocks_ = nullptr;
  string_block_.store(nullptr, std::memory_order_relaxed);
  string_block_unused_.store(0, std::memory_order_relaxed);
}